

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O3

void Fxu_MatrixDelete(Fxu_Matrix *p)

{
  Vec_Ptr_t *__ptr;
  void **__ptr_00;
  
  Fxu_HeapDoubleCheck(p->pHeapDouble);
  Fxu_HeapDoubleStop(p->pHeapDouble);
  Fxu_HeapSingleStop(p->pHeapSingle);
  Extra_MmFixedStop(p->pMemMan);
  __ptr = p->vPairs;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  if (p->pppPairs != (Fxu_Pair ***)0x0) {
    free(p->pppPairs);
    p->pppPairs = (Fxu_Pair ***)0x0;
  }
  if (p->ppPairs != (Fxu_Pair **)0x0) {
    free(p->ppPairs);
    p->ppPairs = (Fxu_Pair **)0x0;
  }
  if (p->pTable != (Fxu_ListDouble *)0x0) {
    free(p->pTable);
    p->pTable = (Fxu_ListDouble *)0x0;
  }
  if (p->ppVars != (Fxu_Var **)0x0) {
    free(p->ppVars);
  }
  free(p);
  return;
}

Assistant:

void Fxu_MatrixDelete( Fxu_Matrix * p )
{
    Fxu_HeapDoubleCheck( p->pHeapDouble );
    Fxu_HeapDoubleStop( p->pHeapDouble );
    Fxu_HeapSingleStop( p->pHeapSingle );

    // delete other things
#ifdef USE_SYSTEM_MEMORY_MANAGEMENT
    // this code is not needed when the custom memory manager is used
    {
        Fxu_Cube * pCube, * pCube2;
        Fxu_Var * pVar, * pVar2;
        Fxu_Lit * pLit, * pLit2;
        Fxu_Double * pDiv, * pDiv2;
        Fxu_Single * pSingle, * pSingle2;
        Fxu_Pair * pPair, * pPair2;
        int i;
        // delete the divisors
        Fxu_MatrixForEachDoubleSafe( p, pDiv, pDiv2, i )
        {
            Fxu_DoubleForEachPairSafe( pDiv, pPair, pPair2 )
                MEM_FREE_FXU( p, Fxu_Pair, 1, pPair );
               MEM_FREE_FXU( p, Fxu_Double, 1, pDiv );
        }
        Fxu_MatrixForEachSingleSafe( p, pSingle, pSingle2 )
               MEM_FREE_FXU( p, Fxu_Single, 1, pSingle );
        // delete the entries
        Fxu_MatrixForEachCube( p, pCube )
            Fxu_CubeForEachLiteralSafe( pCube, pLit, pLit2 )
                MEM_FREE_FXU( p, Fxu_Lit, 1, pLit );
        // delete the cubes
        Fxu_MatrixForEachCubeSafe( p, pCube, pCube2 )
            MEM_FREE_FXU( p, Fxu_Cube, 1, pCube );
        // delete the vars
        Fxu_MatrixForEachVariableSafe( p, pVar, pVar2 )
            MEM_FREE_FXU( p, Fxu_Var, 1, pVar );
    }
#else
    Extra_MmFixedStop( p->pMemMan );
#endif

    Vec_PtrFree( p->vPairs );
    ABC_FREE( p->pppPairs );
    ABC_FREE( p->ppPairs );
//    ABC_FREE( p->pPairsTemp );
    ABC_FREE( p->pTable );
    ABC_FREE( p->ppVars );
    ABC_FREE( p );
}